

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O0

QStyleOption * __thiscall QStyleOption::operator=(QStyleOption *this,QStyleOption *other)

{
  undefined8 uVar1;
  long in_RSI;
  QStyleOption *in_RDI;
  
  (in_RDI->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i = *(Int *)(in_RSI + 8);
  in_RDI->direction = *(LayoutDirection *)(in_RSI + 0xc);
  uVar1 = *(undefined8 *)(in_RSI + 0x10);
  (in_RDI->rect).x1 = (Representation)(int)uVar1;
  (in_RDI->rect).y1 = (Representation)(int)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(in_RSI + 0x18);
  (in_RDI->rect).x2 = (Representation)(int)uVar1;
  (in_RDI->rect).y2 = (Representation)(int)((ulong)uVar1 >> 0x20);
  QFontMetrics::operator=(&in_RDI->fontMetrics,(QFontMetrics *)(in_RSI + 0x20));
  QPalette::operator=(&in_RDI->palette,(QPalette *)(in_RSI + 0x28));
  in_RDI->styleObject = *(QObject **)(in_RSI + 0x38);
  return in_RDI;
}

Assistant:

QStyleOption &QStyleOption::operator=(const QStyleOption &other)
{
    state = other.state;
    direction = other.direction;
    rect = other.rect;
    fontMetrics = other.fontMetrics;
    palette = other.palette;
    styleObject = other.styleObject;
    return *this;
}